

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadScript
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  uint uVar1;
  int local_2c;
  int tmp;
  int i;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  char *text_local;
  
  local_2c = 0;
  while( true ) {
    if (text[local_2c] == '\0') {
      return local_2c;
    }
    uVar1 = ReadWhitespace(text + local_2c);
    if (((int)uVar1 < 1) &&
       (uVar1 = ReadInstruction(text + local_2c,instrl,errorType), (int)uVar1 < 1)) break;
    local_2c = uVar1 + local_2c;
  }
  if (uVar1 != 0) {
    return uVar1 - local_2c;
  }
  *errorType = SCRPT_ERROR_UNKNOW;
  return -local_2c;
}

Assistant:

int LiteScript::Syntax::ReadScript(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    int i = 0, tmp;
    while (text[i] != '\0'){
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
            i += tmp;
        else {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                return -i;
            }
        }
    }
    return i;
}